

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O2

void Gia_QbfPrint(Qbf_Man_t *p,Vec_Int_t *vValues,int Iter)

{
  uint uVar1;
  abctime aVar2;
  abctime time;
  
  printf("%5d : ",(ulong)(uint)Iter);
  if (vValues->nSize == p->nVars) {
    Vec_IntPrintBinary(vValues);
    printf("  ");
    if (p->pSatSynG == (bmcg_sat_solver *)0x0) {
      uVar1 = sat_solver_nvars(p->pSatSyn);
    }
    else {
      uVar1 = bmcg_sat_solver_varnum(p->pSatSynG);
    }
    printf("Var =%7d  ",(ulong)uVar1);
    if (p->pSatSynG == (bmcg_sat_solver *)0x0) {
      uVar1 = sat_solver_nclauses(p->pSatSyn);
    }
    else {
      uVar1 = bmcg_sat_solver_clausenum(p->pSatSynG);
    }
    printf("Cla =%7d  ",(ulong)uVar1);
    if (p->pSatSynG == (bmcg_sat_solver *)0x0) {
      uVar1 = sat_solver_nconflicts(p->pSatSyn);
    }
    else {
      uVar1 = bmcg_sat_solver_conflictnum(p->pSatSynG);
    }
    printf("Conf =%9d  ",(ulong)uVar1);
    aVar2 = Abc_Clock();
    Abc_PrintTime(0x7ef26a,(char *)(aVar2 - p->clkStart),time);
    return;
  }
  __assert_fail("Vec_IntSize(vValues) == p->nVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaQbf.c"
                ,0x219,"void Gia_QbfPrint(Qbf_Man_t *, Vec_Int_t *, int)");
}

Assistant:

void Gia_QbfPrint( Qbf_Man_t * p, Vec_Int_t * vValues, int Iter )
{
    printf( "%5d : ", Iter );
    assert( Vec_IntSize(vValues) == p->nVars );
    Vec_IntPrintBinary( vValues ); printf( "  " );
    printf( "Var =%7d  ",  p->pSatSynG ? bmcg_sat_solver_varnum(p->pSatSynG)      : sat_solver_nvars(p->pSatSyn)      );
    printf( "Cla =%7d  ",  p->pSatSynG ? bmcg_sat_solver_clausenum(p->pSatSynG)   : sat_solver_nclauses(p->pSatSyn)   );
    printf( "Conf =%9d  ", p->pSatSynG ? bmcg_sat_solver_conflictnum(p->pSatSynG) : sat_solver_nconflicts(p->pSatSyn) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
}